

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FeatureSet *this;
  Builder *this_00;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  Expression *left;
  pointer pcVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  _Hash_node_base *p_Var14;
  _Hash_node_base *p_Var15;
  _Hash_node_base *p_Var16;
  _Hash_node_base *p_Var17;
  _Hash_node_base *p_Var18;
  Name root;
  ulong *puVar19;
  char cVar20;
  byte bVar21;
  uint uVar22;
  string *psVar23;
  iterator iVar24;
  ostream *poVar25;
  mapped_type *pmVar26;
  undefined8 uVar27;
  Call *right;
  Block *pBVar28;
  __node_ptr p_Var29;
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var30;
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var31;
  mapped_type *pmVar32;
  long lVar33;
  size_type sVar34;
  mapped_type *pmVar35;
  Fatal *this_01;
  undefined1 auVar36 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  Module *pMVar37;
  uint uVar38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr;
  pointer pMVar39;
  pointer puVar40;
  pointer puVar41;
  pointer puVar42;
  pointer puVar43;
  pointer puVar44;
  pointer puVar45;
  pointer puVar46;
  ulong *puVar47;
  undefined8 *puVar48;
  undefined8 *puVar49;
  _Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *__k;
  string *str;
  unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
  *__k_00;
  char *pcVar50;
  char *pcVar51;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  undefined8 *puVar52;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *import_1;
  _Hash_node_base *p_Var53;
  undefined8 *puVar54;
  __hash_code __code;
  Name target;
  Name NVar55;
  optional<wasm::Type> type;
  Name NVar56;
  Name NVar57;
  Name NVar58;
  Name NVar59;
  Name NVar60;
  Name NVar61;
  undefined1 local_a08 [8];
  ToolOptions options;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_868;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_840;
  _Any_data local_818;
  code *local_808;
  code *local_800;
  _Any_data local_7f8;
  code *local_7e8;
  code *local_7e0;
  _Any_data local_7d8;
  code *local_7c8;
  code *local_7c0;
  _Any_data local_7b8;
  code *local_7a8;
  code *local_7a0;
  _Any_data local_798;
  code *local_788;
  code *local_780;
  _Any_data local_778;
  code *local_768;
  code *local_760;
  undefined1 local_758 [8];
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  inputSourceMapFilenames;
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  size_type *local_488;
  string outputSourceMapUrl;
  string outputSourceMapFilename;
  Builder builder;
  IString local_428;
  string_view local_418 [2];
  undefined1 auStack_3f8 [8];
  KindNameUpdates kindNameUpdates;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  pointer local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390 [18];
  undefined2 local_268 [2];
  undefined4 local_264;
  ModuleReader reader;
  undefined1 local_248 [8];
  value_type inputFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> inputSourceMapFilename;
  _Any_data local_1e8;
  id local_1d8;
  atomic<MixedArena_*> aStack_1d0;
  undefined1 local_1c0 [8];
  KindNameUpdates kindNameUpdates_1;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> laterInput;
  undefined1 auStack_168 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFileNames;
  string local_148 [8];
  string WasmMergeOption;
  value_type inputFile;
  undefined1 auStack_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFiles;
  undefined1 local_d0 [8];
  __single_object copy;
  undefined1 auStack_a0 [16];
  pointer local_90;
  undefined1 auStack_88 [8];
  bool valid;
  code *local_78;
  pointer local_70;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  Module *local_40;
  undefined1 local_32;
  undefined1 local_31 [7];
  bool emitBinary;
  bool debugInfo;
  
  inputFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_f8 = (undefined1  [8])0x0;
  inputFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputFileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&inputSourceMapFilenames;
  inputSourceMapFilenames._M_t._M_impl._0_4_ = 0;
  auStack_168 = (undefined1  [8])0x0;
  inputFileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_32 = 1;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  outputSourceMapUrl.field_2._8_8_ = &outputSourceMapFilename._M_string_length;
  outputSourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  local_31[0] = 0;
  outputSourceMapFilename._M_string_length._0_1_ = 0;
  local_488 = &outputSourceMapUrl._M_string_length;
  outputSourceMapUrl._M_dataplus._M_p = (pointer)0x0;
  outputSourceMapUrl._M_string_length._0_1_ = 0;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"wasm-merge options",(allocator<char> *)auStack_3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_3f8,"wasm-merge",(allocator<char> *)local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,
             "Merge wasm files into one.\n\nFor example,\n\n  wasm-merge foo.wasm foo bar.wasm bar -o merged.wasm\n\nwill read foo.wasm and bar.wasm, with names \'foo\' and \'bar\' respectively, so if the second imports from \'foo\', we will see that as an import from the first module after the merge. The merged output will be written to merged.wasm.\n\nNote that filenames and modules names are interleaved (which is hopefully less confusing).\n\nInput source maps can be specified by adding an -ism option right after the module name:\n\n  wasm-merge foo.wasm foo -ism foo.wasm.map ..."
             ,(allocator<char> *)auStack_88);
  wasm::ToolOptions::ToolOptions((ToolOptions *)local_a08,(string *)auStack_3f8,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)auStack_3f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)auStack_3f8,"--output",&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,"-o",&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,"Output file",&local_57);
  auStack_88 = (undefined1  [8])0x0;
  _valid = 0;
  local_70 = (pointer)std::
                      _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:596:10)>
                      ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:596:10)>
             ::_M_manager;
  psVar23 = (string *)
            wasm::Options::add((string *)&options,(string *)auStack_3f8,(string *)local_d0,
                               (string *)local_1c0,(Arguments)local_148,(function *)0x1,
                               SUB81((allocator<char> *)auStack_88,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(WasmMergeOption.field_2._M_local_buf + 8),"INFILE1 NAME1 INFILE2 NAME2 [..]"
             ,&local_56);
  inputFileName.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:602:21)>
       ::_M_invoke;
  inputFileName._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:602:21)>
       ::_M_manager;
  local_248 = (undefined1  [8])auStack_f8;
  inputFileName._M_dataplus._M_p = auStack_168;
  psVar23 = (string *)
            wasm::Options::add_positional(psVar23,(int)&WasmMergeOption + 0x18,(function *)0x2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(inputFileName.field_2._M_local_buf + 8),"--input-source-map",&local_55);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(inputSourceMapFilename.field_2._M_local_buf + 8),"-ism",&local_54);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_418,"Consume source maps from the specified files",&local_53);
  local_1d8._M_thread = 0;
  aStack_1d0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_1e8._M_unused._M_object = (void *)0x0;
  local_1e8._8_8_ = (char *)0x0;
  local_1e8._M_unused._M_object = operator_new(0x18);
  *(undefined1 **)local_1e8._M_unused._0_8_ = auStack_f8;
  *(undefined1 **)((long)local_1e8._M_unused._0_8_ + 8) = auStack_168;
  *(undefined1 **)((long)local_1e8._M_unused._0_8_ + 0x10) = local_758;
  aStack_1d0._M_b._M_p =
       (__base_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:614:10)>
       ::_M_invoke;
  local_1d8._M_thread =
       (native_handle_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:614:10)>
       ::_M_manager;
  psVar23 = (string *)
            wasm::Options::add(psVar23,(string *)(inputFileName.field_2._M_local_buf + 8),
                               (string *)(inputSourceMapFilename.field_2._M_local_buf + 8),
                               (string *)local_418,(Arguments)local_148,(function *)0x2,
                               SUB81(&local_1e8,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,"--output-source-map",&local_52);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(outputSourceMapFilename.field_2._M_local_buf + 8),"-osm",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kindNameUpdates_1._M_h._M_single_bucket,
             "Emit source map to the specified file",&local_50);
  local_818._8_8_ = 0;
  local_818._M_unused._0_8_ = (undefined8)((long)&outputSourceMapUrl.field_2 + 8);
  local_800 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:629:10)>
              ::_M_invoke;
  local_808 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:629:10)>
              ::_M_manager;
  psVar23 = (string *)
            wasm::Options::add(psVar23,(string *)local_268,
                               (string *)(outputSourceMapFilename.field_2._M_local_buf + 8),
                               (string *)&kindNameUpdates_1._M_h._M_single_bucket,
                               (Arguments)local_148,(function *)0x1,SUB81(&local_818,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "--output-source-map-url",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>(local_708,"-osu",&local_4e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e8,"Emit specified string as source map URL",&local_4d);
  local_7f8._8_8_ = 0;
  local_7f8._M_unused._M_object = &local_488;
  local_7e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:637:10)>
              ::_M_invoke;
  local_7e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:637:10)>
              ::_M_manager;
  psVar23 = (string *)
            wasm::Options::add(psVar23,(string *)
                                       &inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count,local_708,local_6e8,(Arguments)local_148,
                               (function *)0x1,SUB81(&local_7f8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_6c8,"--rename-export-conflicts",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>(local_6a8,"-rec",&local_4b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_688,"Rename exports to avoid conflicts (rather than error)",&local_4a);
  local_798._M_unused._M_object = (void *)0x0;
  local_798._8_8_ = 0;
  local_780 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:645:10)>
              ::_M_invoke;
  local_788 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:645:10)>
              ::_M_manager;
  psVar23 = (string *)
            wasm::Options::add(psVar23,local_6c8,local_6a8,local_688,(Arguments)local_148,
                               (function *)0x0,SUB81(&local_798,0));
  std::__cxx11::string::string<std::allocator<char>>(local_668,"--skip-export-conflicts",&local_49);
  std::__cxx11::string::string<std::allocator<char>>(local_648,"-sec",&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            (local_628,"Skip exports that conflict with previous ones",&local_47);
  local_778._M_unused._M_object = (void *)0x0;
  local_778._8_8_ = 0;
  local_760 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:653:10)>
              ::_M_invoke;
  local_768 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:653:10)>
              ::_M_manager;
  psVar23 = (string *)
            wasm::Options::add(psVar23,local_668,local_648,local_628,(Arguments)local_148,
                               (function *)0x0,SUB81(&local_778,0));
  std::__cxx11::string::string<std::allocator<char>>(local_608,"--emit-text",&local_46);
  std::__cxx11::string::string<std::allocator<char>>(local_5e8,"-S",&local_45);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c8,"Emit text instead of binary for the output file",&local_44);
  local_7d8._8_8_ = 0;
  local_7d8._M_unused._M_object = &local_32;
  local_7c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:661:10)>
              ::_M_invoke;
  local_7c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:661:10)>
              ::_M_manager;
  psVar23 = (string *)
            wasm::Options::add(psVar23,local_608,local_5e8,local_5c8,(Arguments)local_148,
                               (function *)0x0,SUB81(&local_7d8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5a8,"--debuginfo",&local_43);
  std::__cxx11::string::string<std::allocator<char>>(local_588,"-g",&local_42);
  std::__cxx11::string::string<std::allocator<char>>
            (local_568,"Emit names section and debug info",&local_41);
  local_7b8._8_8_ = 0;
  local_7b8._M_unused._M_object = local_31;
  local_7a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:667:10)>
              ::_M_invoke;
  local_7a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:667:10)>
              ::_M_manager;
  wasm::Options::add(psVar23,local_5a8,local_588,local_568,(Arguments)local_148,(function *)0x0,
                     SUB81(&local_7b8,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_7b8);
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string(local_588);
  std::__cxx11::string::~string(local_5a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_7d8);
  std::__cxx11::string::~string(local_5c8);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::string::~string(local_608);
  std::_Function_base::~_Function_base((_Function_base *)&local_778);
  std::__cxx11::string::~string(local_628);
  std::__cxx11::string::~string(local_648);
  std::__cxx11::string::~string(local_668);
  std::_Function_base::~_Function_base((_Function_base *)&local_798);
  std::__cxx11::string::~string(local_688);
  std::__cxx11::string::~string(local_6a8);
  std::__cxx11::string::~string(local_6c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_7f8);
  std::__cxx11::string::~string(local_6e8);
  std::__cxx11::string::~string(local_708);
  std::__cxx11::string::~string
            ((string *)&inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::_Function_base::~_Function_base((_Function_base *)&local_818);
  std::__cxx11::string::~string((string *)&kindNameUpdates_1._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)(outputSourceMapFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_268);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
  std::__cxx11::string::~string((string *)local_418);
  std::__cxx11::string::~string((string *)(inputSourceMapFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(inputFileName.field_2._M_local_buf + 8));
  std::_Function_base::~_Function_base((_Function_base *)local_248);
  std::__cxx11::string::~string((string *)(WasmMergeOption.field_2._M_local_buf + 8));
  std::_Function_base::~_Function_base((_Function_base *)auStack_88);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)auStack_3f8);
  wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  auVar36 = (undefined1  [8])
            ((long)inputFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_f8);
  if (auVar36 ==
      (undefined1  [8])
      ((long)inputFileNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_168)) {
    uVar38 = 0;
    while( true ) {
      puVar19 = DAT_00133320;
      pMVar39 = (pointer)(ulong)uVar38;
      if ((pointer)((long)inputFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)auStack_f8 >> 5) <=
          pMVar39) break;
      std::__cxx11::string::string
                ((string *)(WasmMergeOption.field_2._M_local_buf + 8),
                 (string *)((long)auStack_f8 + pMVar39 * 0x20));
      std::__cxx11::string::string
                ((string *)local_248,(string *)((long)auStack_168 + pMVar39 * 0x20));
      auStack_3f8 = (undefined1  [8])pMVar39;
      iVar24 = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_758,(key_type *)auStack_3f8);
      if (iVar24._M_node == (_Base_ptr)&inputSourceMapFilenames) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(inputFileName.field_2._M_local_buf + 8),"",
                   (allocator<char> *)auStack_3f8);
      }
      else {
        std::__cxx11::string::string
                  ((string *)(inputFileName.field_2._M_local_buf + 8),
                   (string *)&iVar24._M_node[1]._M_parent);
      }
      if ((char)options._vptr_ToolOptions == '\x01') {
        poVar25 = std::operator<<((ostream *)&std::cerr,"reading input \'");
        poVar25 = std::operator<<(poVar25,(string *)(WasmMergeOption.field_2._M_local_buf + 8));
        poVar25 = std::operator<<(poVar25,"\' as \'");
        poVar25 = std::operator<<(poVar25,(string *)local_248);
        std::operator<<(poVar25,"\'...\n");
      }
      kindNameUpdates_1._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pMVar37 = (Module *)&(anonymous_namespace)::merged;
      if (pMVar39 != (pointer)0x0) {
        std::make_unique<wasm::Module>();
        auVar36 = auStack_3f8;
        auStack_3f8 = (undefined1  [8])0x0;
        std::__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>::reset
                  ((__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_> *)
                   &kindNameUpdates_1._M_h._M_single_bucket,(pointer)auVar36);
        std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
                  ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)auStack_3f8);
        pMVar37 = (Module *)kindNameUpdates_1._M_h._M_single_bucket;
      }
      uVar22 = (pMVar37->features).features | options._368_4_;
      (pMVar37->features).features = uVar22;
      (pMVar37->features).features = ~options.profile & uVar22;
      local_264 = 0;
      reader.super_ModuleIOBase.debugInfo = false;
      local_268[0] = 1;
      local_40 = pMVar37;
      std::__cxx11::string::string(local_548,(string *)(WasmMergeOption.field_2._M_local_buf + 8));
      this = &options.enabledFeatures;
      std::__cxx11::string::string
                ((string *)this,(string *)(inputFileName.field_2._M_local_buf + 8));
      auVar36 = (undefined1  [8])this;
      wasm::ModuleReader::read(local_268,local_548,local_40);
      std::__cxx11::string::~string((string *)this);
      std::__cxx11::string::~string(local_548);
      if (options.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ == '\0') {
        std::
        _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear(&(local_40->typeIndices)._M_h);
      }
      if ((options._177_1_ != '\0') &&
         (cVar20 = wasm::WasmValidator::validate((Module *)auStack_3f8,(uint)local_40),
         cVar20 == '\0')) {
        poVar25 = (ostream *)std::operator<<((ostream *)&std::cout,local_40);
        std::operator<<(poVar25,'\n');
        wasm::Fatal::Fatal((Fatal *)auStack_3f8);
        std::operator<<((ostream *)&kindNameUpdates._M_h._M_bucket_count,
                        "error in validating input: ");
        wasm::Fatal::operator<<
                  ((Fatal *)auStack_3f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&WasmMergeOption.field_2 + 8));
        goto LAB_00117aee;
      }
      puVar19 = DAT_00133320;
      puVar47 = (anonymous_namespace)::merged;
      if (kindNameUpdates_1._M_h._M_single_bucket == (__node_base_ptr)0x0) {
        for (; puVar47 != puVar19; puVar47 = puVar47 + 1) {
          str = (string *)local_248;
          wasm::IString::IString((IString *)auStack_3f8,str);
          kindNameUpdates._M_h._M_bucket_count = *(size_type *)*puVar47;
          kindNameUpdates._M_h._M_before_begin._M_nxt =
               (_Hash_node_base *)((size_type *)*puVar47)[1];
          local_d0 = (undefined1  [8])*puVar47;
          pmVar26 = std::
                    unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                    ::operator[]((unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                                  *)local_d0,(key_type *)str);
          (pmVar26->moduleName).super_IString.str._M_len = (size_t)auStack_3f8;
          (pmVar26->moduleName).super_IString.str._M_str = (char *)kindNameUpdates._M_h._M_buckets;
          (pmVar26->baseName).super_IString.str._M_len = kindNameUpdates._M_h._M_bucket_count;
          (pmVar26->baseName).super_IString.str._M_str =
               (char *)kindNameUpdates._M_h._M_before_begin._M_nxt;
        }
      }
      else {
        wasm::IString::IString(&local_428,(string *)local_248);
        local_90 = (pointer)local_428.str._M_str;
        auStack_a0._8_8_ = local_428.str._M_len;
        auStack_3f8 = (undefined1  [8])&kindNameUpdates._M_h._M_rehash_policy._M_next_resize;
        kindNameUpdates._M_h._M_buckets = (__buckets_ptr)0x1;
        kindNameUpdates._M_h._M_bucket_count = 0;
        kindNameUpdates._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        kindNameUpdates._M_h._M_element_count =
             CONCAT44(kindNameUpdates._M_h._M_element_count._4_4_,0x3f800000);
        kindNameUpdates._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        kindNameUpdates._M_h._M_rehash_policy._4_4_ = 0;
        kindNameUpdates._M_h._M_rehash_policy._M_next_resize = 0;
        puVar1 = (local_40->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_d0 = (undefined1  [8])auStack_3f8;
        for (puVar40 = (local_40->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar40 != puVar1;
            puVar40 = puVar40 + 1) {
          NVar55 = wasm::Names::getValidFunctionName
                             ((Module *)&(anonymous_namespace)::merged,
                              (Name)*(string_view *)
                                     &((puVar40->_M_t).
                                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)
                                      ->super_Importable);
          auVar36 = NVar55.super_IString.str._M_len;
          anon_unknown.dwarf_3eca4::renameInputItems::anon_class_8_1_beba256b::operator()
                    ((anon_class_8_1_beba256b *)local_d0,Function,
                     (Name *)(puVar40->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,NVar55);
        }
        puVar2 = (local_40->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar41 = (local_40->globals).
                       super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar41 != puVar2;
            puVar41 = puVar41 + 1) {
          NVar55 = wasm::Names::getValidGlobalName
                             ((Module *)&(anonymous_namespace)::merged,
                              (Name)*(string_view *)
                                     &((puVar41->_M_t).
                                       super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                       .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->
                                      super_Importable);
          auVar36 = NVar55.super_IString.str._M_len;
          anon_unknown.dwarf_3eca4::renameInputItems::anon_class_8_1_beba256b::operator()
                    ((anon_class_8_1_beba256b *)local_d0,Global,
                     (Name *)(puVar41->_M_t).
                             super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                             .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,NVar55);
        }
        puVar3 = (local_40->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar42 = (local_40->tags).
                       super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar42 != puVar3;
            puVar42 = puVar42 + 1) {
          NVar55 = wasm::Names::getValidTagName
                             ((Module *)&(anonymous_namespace)::merged,
                              (Name)*(string_view *)
                                     &((puVar42->_M_t).
                                       super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                       .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->
                                      super_Importable);
          auVar36 = NVar55.super_IString.str._M_len;
          anon_unknown.dwarf_3eca4::renameInputItems::anon_class_8_1_beba256b::operator()
                    ((anon_class_8_1_beba256b *)local_d0,Tag,
                     (Name *)(puVar42->_M_t).
                             super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl,NVar55);
        }
        puVar4 = (local_40->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar43 = (local_40->elementSegments).
                       super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar43 != puVar4;
            puVar43 = puVar43 + 1) {
          NVar55 = wasm::Names::getValidElementSegmentName
                             ((Module *)&(anonymous_namespace)::merged,
                              (Name)*(string_view *)
                                     (puVar43->_M_t).
                                     super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                     .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                     _M_head_impl);
          auVar36 = NVar55.super_IString.str._M_len;
          anon_unknown.dwarf_3eca4::renameInputItems::anon_class_8_1_beba256b::operator()
                    ((anon_class_8_1_beba256b *)local_d0,ElementSegment,
                     (Name *)(puVar43->_M_t).
                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl,
                     NVar55);
        }
        puVar5 = (local_40->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar44 = (local_40->memories).
                       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar44 != puVar5;
            puVar44 = puVar44 + 1) {
          NVar55 = wasm::Names::getValidMemoryName
                             ((Module *)&(anonymous_namespace)::merged,
                              (Name)*(string_view *)
                                     &((puVar44->_M_t).
                                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                       .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                                      super_Importable);
          auVar36 = NVar55.super_IString.str._M_len;
          anon_unknown.dwarf_3eca4::renameInputItems::anon_class_8_1_beba256b::operator()
                    ((anon_class_8_1_beba256b *)local_d0,Memory,
                     (Name *)(puVar44->_M_t).
                             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,NVar55);
        }
        puVar6 = (local_40->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar45 = (local_40->dataSegments).
                       super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar45 != puVar6;
            puVar45 = puVar45 + 1) {
          NVar55 = wasm::Names::getValidDataSegmentName
                             ((Module *)&(anonymous_namespace)::merged,
                              (Name)*(string_view *)
                                     &((puVar45->_M_t).
                                       super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                       .super__Head_base<0UL,_wasm::DataSegment_*,_false>.
                                      _M_head_impl)->super_Named);
          auVar36 = NVar55.super_IString.str._M_len;
          anon_unknown.dwarf_3eca4::renameInputItems::anon_class_8_1_beba256b::operator()
                    ((anon_class_8_1_beba256b *)local_d0,DataSegment,
                     (Name *)(puVar45->_M_t).
                             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                             .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl,NVar55)
          ;
        }
        puVar7 = (local_40->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar46 = (local_40->tables).
                       super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pMVar37 = local_40,
            puVar46 != puVar7; puVar46 = puVar46 + 1) {
          NVar55 = wasm::Names::getValidTableName
                             ((Module *)&(anonymous_namespace)::merged,
                              (Name)*(string_view *)
                                     &((puVar46->_M_t).
                                       super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                       .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                                      super_Importable);
          auVar36 = NVar55.super_IString.str._M_len;
          anon_unknown.dwarf_3eca4::renameInputItems::anon_class_8_1_beba256b::operator()
                    ((anon_class_8_1_beba256b *)local_d0,Table,
                     (Name *)(puVar46->_M_t).
                             super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                             .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl,NVar55);
        }
        anon_unknown.dwarf_3eca4::updateNames(local_40,(KindNameUpdates *)auStack_3f8);
        std::
        _Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)auStack_3f8);
        __k = (_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &(anonymous_namespace)::merged;
        wasm::ModuleUtils::copyModuleItems(pMVar37,(Module *)&(anonymous_namespace)::merged);
        p_Var8 = (_Hash_node_base *)
                 (local_40->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (p_Var53 = (_Hash_node_base *)
                       (local_40->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; p_Var53 != p_Var8;
            p_Var53 = p_Var53 + 1) {
          p_Var9 = p_Var53->_M_nxt;
          local_1c0 = (undefined1  [8])operator_new(0x30);
          p_Var14 = p_Var9->_M_nxt;
          p_Var15 = p_Var9[1]._M_nxt;
          p_Var16 = p_Var9[2]._M_nxt;
          p_Var17 = p_Var9[3]._M_nxt;
          p_Var18 = p_Var9[5]._M_nxt;
          (((Module *)local_1c0)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var9[4]._M_nxt;
          (((Module *)local_1c0)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var18;
          (((Module *)local_1c0)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var16;
          (((Module *)local_1c0)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var17;
          (((Module *)local_1c0)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var14;
          (((Module *)local_1c0)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var15;
          auStack_3f8 = (undefined1  [8])p_Var9->_M_nxt;
          kindNameUpdates._M_h._M_buckets = &(p_Var9[1]._M_nxt)->_M_nxt;
          local_d0 = local_1c0;
          pmVar26 = std::
                    unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                    ::operator[]((unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                                  *)local_1c0,(key_type *)__k);
          (pmVar26->moduleName).super_IString.str._M_len = auStack_a0._8_8_;
          (pmVar26->moduleName).super_IString.str._M_str = (char *)local_90;
          (pmVar26->baseName).super_IString.str._M_len = (size_t)auStack_3f8;
          (pmVar26->baseName).super_IString.str._M_str = (char *)kindNameUpdates._M_h._M_buckets;
          __k = *(_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  **)local_d0;
          NVar55 = wasm::Names::getValidExportName
                             ((Module *)&(anonymous_namespace)::merged,(IString)*(IString *)local_d0
                             );
          *(IString *)local_d0 = NVar55.super_IString.str;
          auVar36 = local_d0;
          if (NVar55.super_IString.str._M_str == p_Var53->_M_nxt[1]._M_nxt) {
LAB_00116540:
            __k = (_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   *)local_d0;
            wasm::Module::addExport((unique_ptr *)&(anonymous_namespace)::merged);
          }
          else if ((anonymous_namespace)::exportMergeMode != 2) {
            if ((anonymous_namespace)::exportMergeMode != 0) goto LAB_00116540;
            wasm::Fatal::Fatal((Fatal *)auStack_3f8);
            std::operator<<((ostream *)&kindNameUpdates._M_h._M_bucket_count,
                            "Export name conflict: ");
            this_01 = wasm::Fatal::operator<<((Fatal *)auStack_3f8,(Name *)p_Var53->_M_nxt);
            std::operator<<((ostream *)&this_01->field_0x10," (consider");
            std::operator<<((ostream *)&this_01->field_0x10," --rename-export-conflicts or");
            wasm::Fatal::operator<<(this_01,(char (*) [27])" --skip-export-conflicts)\n");
            goto LAB_00117aee;
          }
          std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                    ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)local_d0);
        }
        if ((local_40->start).super_IString.str._M_str != (char *)0x0) {
          if (_DAT_001333e0 == (pointer)0x0) {
            _DAT_001333d8 = (pointer)(local_40->start).super_IString.str._M_len;
            _DAT_001333e0 = (pointer)(local_40->start).super_IString.str._M_str;
          }
          else {
            wasm::Name::Name((Name *)local_418,"merged.start.old");
            join_0x00000010_0x00000000_ =
                 (string_view)
                 wasm::Names::getValidFunctionName
                           ((Module *)&(anonymous_namespace)::merged,(Name)local_418[0]);
            wasm::Name::Name((Name *)&local_1e8,"merged.start.new");
            root.super_IString.str._M_str = (char *)local_1e8._8_8_;
            root.super_IString.str._M_len = local_1e8._M_unused._0_8_;
            NVar55 = wasm::Names::getValidFunctionName
                               ((Module *)&(anonymous_namespace)::merged,root);
            target.super_IString.str._M_str = NVar55.super_IString.str._M_str;
            NVar56.super_IString.str._M_str = (char *)_DAT_001333d8;
            NVar56.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
            uVar27 = wasm::Module::getFunction(NVar56);
            kindNameUpdates._M_h._M_before_begin._M_nxt =
                 kindNameUpdates._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
            auVar36 = (undefined1  [8])
                      wasm::ModuleUtils::copyFunction
                                (uVar27,&(anonymous_namespace)::merged,auStack_a0._8_8_,local_90,
                                 (_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)auStack_3f8,
                                 (_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)local_d0);
            std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            _M_reset((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)local_d0);
            std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            _M_reset((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)auStack_3f8);
            NVar57.super_IString.str._M_str = (char *)(local_40->start).super_IString.str._M_len;
            NVar57.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
            uVar27 = wasm::Module::getFunction(NVar57);
            kindNameUpdates_1._M_h._M_before_begin._M_nxt =
                 kindNameUpdates_1._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
            local_70 = (pointer)((ulong)local_70 & 0xffffffffffffff00);
            local_40 = NVar55.super_IString.str._M_len;
            wasm::ModuleUtils::copyFunction
                      (uVar27,&(anonymous_namespace)::merged,NVar55.super_IString.str._M_len,
                       target.super_IString.str._M_str);
            std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            _M_reset((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)auStack_88);
            std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            _M_reset((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)local_1c0);
            outputSourceMapFilename.field_2._8_8_ = &(anonymous_namespace)::merged;
            left = (Expression *)
                   (((Module *)auVar36)->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            inputSourceMapFilename.field_2._8_8_ = 0;
            this_00 = (Builder *)((long)&outputSourceMapFilename.field_2 + 8);
            args = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   (&inputSourceMapFilename.field_2._M_allocated_capacity + 1);
            target.super_IString.str._M_len = (size_t)local_40;
            right = wasm::Builder::makeCall(this_00,target,args,(Type)0x0,false);
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)args;
            pBVar28 = wasm::Builder::makeSequence(this_00,left,(Expression *)right,type);
            (((Module *)auVar36)->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar28;
            std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
            ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          ((long)&inputSourceMapFilename.field_2 + 8));
            _DAT_001333d8 = (pointer)auStack_a0._8_8_;
            _DAT_001333e0 = local_90;
          }
        }
        if ((options._177_1_ == '\x01') &&
           (cVar20 = wasm::WasmValidator::validate((Module *)auStack_3f8,0x133318), cVar20 == '\0'))
        {
          poVar25 = (ostream *)
                    std::operator<<((ostream *)&std::cout,(Module *)&(anonymous_namespace)::merged);
          std::operator<<(poVar25,'\n');
          wasm::Fatal::Fatal((Fatal *)auStack_3f8);
          std::operator<<((ostream *)&kindNameUpdates._M_h._M_bucket_count,
                          "error in validating merged after: ");
          wasm::Fatal::operator<<
                    ((Fatal *)auStack_3f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&WasmMergeOption.field_2 + 8));
          goto LAB_00117aee;
        }
      }
      std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
                ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)
                 &kindNameUpdates_1._M_h._M_single_bucket);
      std::__cxx11::string::~string((string *)(inputFileName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_248);
      std::__cxx11::string::~string((string *)(WasmMergeOption.field_2._M_local_buf + 8));
      uVar38 = uVar38 + 1;
    }
    local_d0 = (undefined1  [8])auStack_a0;
    copy._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
         (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)0x1;
    auStack_a0._0_8_ = (_Hash_node_base *)0x0;
    for (puVar47 = (anonymous_namespace)::merged; puVar52 = DAT_00133338, puVar47 != puVar19;
        puVar47 = puVar47 + 1) {
      pcVar10 = (pointer)*puVar47;
      if (pcVar10[0x28] == '\0') {
        __k_00 = (unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                  *)auStack_3f8;
        auStack_3f8 = (undefined1  [8])pcVar10;
        p_Var29 = std::
                  _Hashtable<wasm::Export_*,_std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Export_*>,_std::hash<wasm::Export_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_find_node((_Hashtable<wasm::Export_*,_std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Export_*>,_std::hash<wasm::Export_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  *)((ulong)pcVar10 % DAT_00133710),(size_type)auStack_3f8,
                                 (key_type *)((ulong)pcVar10 % DAT_00133710),(__hash_code)auVar36);
        if (p_Var29 == (__node_ptr)0x0) {
          __assert_fail("exportModuleMap.count(ex.get())",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp"
                        ,0x1c0,"void (anonymous namespace)::fuseImportsAndExports()");
        }
        auStack_3f8 = (undefined1  [8])pcVar10;
        pmVar26 = std::
                  unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                  ::operator[]((unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                                *)auStack_3f8,(key_type *)__k_00);
        p_Var30 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_d0,(key_type *)(*puVar47 + 0x10));
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var30,&pmVar26->moduleName);
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,&pmVar26->baseName);
        uVar11 = *(undefined4 *)(pcVar10 + 0x1c);
        uVar12 = *(undefined4 *)(pcVar10 + 0x20);
        uVar13 = *(undefined4 *)(pcVar10 + 0x24);
        *(undefined4 *)&(pmVar32->super_IString).str._M_len = *(undefined4 *)(pcVar10 + 0x18);
        *(undefined4 *)((long)&(pmVar32->super_IString).str._M_len + 4) = uVar11;
        *(undefined4 *)&(pmVar32->super_IString).str._M_str = uVar12;
        *(undefined4 *)((long)&(pmVar32->super_IString).str._M_str + 4) = uVar13;
      }
    }
    local_1c0 = (undefined1  [8])&kindNameUpdates_1._M_h._M_rehash_policy._M_next_resize;
    kindNameUpdates_1._M_h._M_buckets = (__buckets_ptr)0x1;
    kindNameUpdates_1._M_h._M_bucket_count = 0;
    kindNameUpdates_1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    kindNameUpdates_1._M_h._M_element_count._0_4_ = 0x3f800000;
    kindNameUpdates_1._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    kindNameUpdates_1._M_h._M_rehash_policy._4_4_ = 0;
    kindNameUpdates_1._M_h._M_rehash_policy._M_next_resize = 0;
    auStack_3f8 = (undefined1  [8])local_d0;
    kindNameUpdates._M_h._M_buckets = (__buckets_ptr)local_1c0;
    for (puVar48 = DAT_00133330; puVar49 = DAT_001333c8, puVar48 != puVar52; puVar48 = puVar48 + 1)
    {
      if ((((Importable *)*puVar48)->module).super_IString.str._M_str != (char *)0x0) {
        anon_unknown.dwarf_3eca4::fuseImportsAndExports::anon_class_16_2_dbdf03cb::operator()
                  ((anon_class_16_2_dbdf03cb *)auStack_3f8,Function,(Importable *)*puVar48);
      }
    }
    for (puVar52 = DAT_001333c0; puVar48 = DAT_00133398, puVar52 != puVar49; puVar52 = puVar52 + 1)
    {
      if ((((Importable *)*puVar52)->module).super_IString.str._M_str != (char *)0x0) {
        anon_unknown.dwarf_3eca4::fuseImportsAndExports::anon_class_16_2_dbdf03cb::operator()
                  ((anon_class_16_2_dbdf03cb *)auStack_3f8,Table,(Importable *)*puVar52);
      }
    }
    for (puVar52 = DAT_00133390; puVar49 = DAT_00133350, puVar52 != puVar48; puVar52 = puVar52 + 1)
    {
      if ((((Importable *)*puVar52)->module).super_IString.str._M_str != (char *)0x0) {
        anon_unknown.dwarf_3eca4::fuseImportsAndExports::anon_class_16_2_dbdf03cb::operator()
                  ((anon_class_16_2_dbdf03cb *)auStack_3f8,Memory,(Importable *)*puVar52);
      }
    }
    for (puVar52 = DAT_00133348; puVar48 = DAT_00133368, puVar52 != puVar49; puVar52 = puVar52 + 1)
    {
      if ((((Importable *)*puVar52)->module).super_IString.str._M_str != (char *)0x0) {
        anon_unknown.dwarf_3eca4::fuseImportsAndExports::anon_class_16_2_dbdf03cb::operator()
                  ((anon_class_16_2_dbdf03cb *)auStack_3f8,Global,(Importable *)*puVar52);
      }
    }
    for (puVar52 = DAT_00133360; puVar49 = DAT_00133338, puVar52 != puVar48; puVar52 = puVar52 + 1)
    {
      if ((((Importable *)*puVar52)->module).super_IString.str._M_str != (char *)0x0) {
        anon_unknown.dwarf_3eca4::fuseImportsAndExports::anon_class_16_2_dbdf03cb::operator()
                  ((anon_class_16_2_dbdf03cb *)auStack_3f8,Tag,(Importable *)*puVar52);
      }
    }
    auStack_88[0] = 1;
    for (puVar52 = DAT_00133330; puVar48 = DAT_001333c8, puVar54 = DAT_001333c0, puVar52 != puVar49;
        puVar52 = puVar52 + 1) {
      pcVar51 = (char *)*puVar52;
      if (*(long *)(pcVar51 + 0x20) != 0) {
        auStack_3f8 = (undefined1  [8])((ulong)auStack_3f8 & 0xffffffff00000000);
        p_Var30 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_d0,(key_type *)auStack_3f8);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var30,(key_type *)(pcVar51 + 0x18));
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)(pcVar51 + 0x28));
        if ((pmVar32->super_IString).str._M_str != (char *)0x0) {
          NVar55.super_IString.str._M_str = (char *)(pmVar32->super_IString).str._M_len;
          NVar55.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
          lVar33 = wasm::Module::getFunction(NVar55);
          cVar20 = wasm::HeapType::isSubType
                             ((HeapType)*(uintptr_t *)(lVar33 + 0x38),
                              (HeapType)*(uintptr_t *)(pcVar51 + 0x38));
          if (cVar20 == '\0') {
            anon_unknown.dwarf_3eca4::reportTypeMismatch
                      ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)"function",pcVar51,
                       (Importable *)auVar36);
            poVar25 = std::operator<<((ostream *)&std::cerr,"type ");
            poVar25 = (ostream *)wasm::operator<<(poVar25,(HeapType)*(uintptr_t *)(lVar33 + 0x38));
            poVar25 = std::operator<<(poVar25," is not a subtype of ");
            poVar25 = (ostream *)wasm::operator<<(poVar25,(HeapType)*(uintptr_t *)(pcVar51 + 0x38));
            std::operator<<(poVar25,".\n");
          }
        }
      }
    }
    for (; puVar52 = DAT_00133398, puVar49 = DAT_00133390, puVar54 != puVar48; puVar54 = puVar54 + 1
        ) {
      pcVar51 = (char *)*puVar54;
      if (*(long *)(pcVar51 + 0x20) != 0) {
        auStack_3f8._0_4_ = 1;
        p_Var30 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_d0,(key_type *)auStack_3f8);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var30,(key_type *)(pcVar51 + 0x18));
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)(pcVar51 + 0x28));
        if ((pmVar32->super_IString).str._M_str != (char *)0x0) {
          NVar58.super_IString.str._M_str = (char *)(pmVar32->super_IString).str._M_len;
          NVar58.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
          lVar33 = wasm::Module::getTable(NVar58);
          if (*(ulong *)(lVar33 + 0x38) < *(ulong *)(pcVar51 + 0x38)) {
            anon_unknown.dwarf_3eca4::reportTypeMismatch
                      ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)"table",pcVar51,
                       (Importable *)auVar36);
            poVar25 = std::operator<<((ostream *)&std::cerr,"minimal size ");
            poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
            poVar25 = std::operator<<(poVar25," is smaller than expected minimal size ");
            poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
            std::operator<<(poVar25,".\n");
          }
          auVar36 = (undefined1  [8])0xffffffff;
          if (*(Module **)(pcVar51 + 0x40) != (Module *)0xffffffff) {
            auVar36 = *(undefined1 (*) [8])(lVar33 + 0x40);
            if (auVar36 == (undefined1  [8])0xffffffff) {
              anon_unknown.dwarf_3eca4::reportTypeMismatch
                        ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)"table",pcVar51,
                         (Importable *)0xffffffff);
              poVar25 = std::operator<<((ostream *)&std::cerr,"expecting a bounded ");
              poVar25 = std::operator<<(poVar25,"table");
              poVar25 = std::operator<<(poVar25," but the imported ");
              poVar25 = std::operator<<(poVar25,"table");
              pcVar50 = " is unbounded.\n";
            }
            else {
              if ((ulong)auVar36 <= *(Module **)(pcVar51 + 0x40)) goto LAB_00116cf6;
              anon_unknown.dwarf_3eca4::reportTypeMismatch
                        ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)"table",pcVar51,
                         (Importable *)auVar36);
              poVar25 = std::operator<<((ostream *)&std::cerr,"maximal size ");
              poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
              poVar25 = std::operator<<(poVar25," is larger than expected maximal size ");
              poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
              pcVar50 = ".\n";
            }
            std::operator<<(poVar25,pcVar50);
          }
LAB_00116cf6:
          if (*(long *)(lVar33 + 0x50) != *(long *)(pcVar51 + 0x50)) {
            anon_unknown.dwarf_3eca4::reportTypeMismatch
                      ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)"table",pcVar51,
                       (Importable *)auVar36);
            poVar25 = std::operator<<((ostream *)&std::cerr,"export type ");
            poVar25 = (ostream *)wasm::operator<<(poVar25,(Type)*(uintptr_t *)(lVar33 + 0x50));
            poVar25 = std::operator<<(poVar25," is different from import type ");
            poVar25 = (ostream *)wasm::operator<<(poVar25,(Type)*(uintptr_t *)(pcVar51 + 0x50));
            std::operator<<(poVar25,".\n");
          }
        }
      }
    }
    for (; puVar48 = DAT_00133350, puVar49 != puVar52; puVar49 = puVar49 + 1) {
      pcVar51 = (char *)*puVar49;
      if (*(long *)(pcVar51 + 0x20) != 0) {
        auStack_3f8._0_4_ = 2;
        p_Var30 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_d0,(key_type *)auStack_3f8);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var30,(key_type *)(pcVar51 + 0x18));
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)(pcVar51 + 0x28));
        if ((pmVar32->super_IString).str._M_str != (char *)0x0) {
          NVar59.super_IString.str._M_str = (char *)(pmVar32->super_IString).str._M_len;
          NVar59.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
          lVar33 = wasm::Module::getMemory(NVar59);
          auVar36 = (undefined1  [8])
                    CONCAT71((int7)((ulong)auVar36 >> 8),*(long *)(pcVar51 + 0x50) == 3);
          if ((*(long *)(lVar33 + 0x50) == 3) != (*(long *)(pcVar51 + 0x50) == 3)) {
            anon_unknown.dwarf_3eca4::reportTypeMismatch
                      ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)0x1260a1,pcVar51,
                       (Importable *)auVar36);
            std::operator<<((ostream *)&std::cerr,"index type should match.\n");
          }
          if (*(ulong *)(lVar33 + 0x38) < *(ulong *)(pcVar51 + 0x38)) {
            anon_unknown.dwarf_3eca4::reportTypeMismatch
                      ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)0x1260a1,pcVar51,
                       (Importable *)auVar36);
            poVar25 = std::operator<<((ostream *)&std::cerr,"minimal size ");
            poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
            poVar25 = std::operator<<(poVar25," is smaller than expected minimal size ");
            poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
            std::operator<<(poVar25,".\n");
          }
          if (*(Module **)(pcVar51 + 0x40) != (Module *)0xffffffffffffffff) {
            auVar36 = *(undefined1 (*) [8])(lVar33 + 0x40);
            if (auVar36 == (undefined1  [8])0xffffffffffffffff) {
              anon_unknown.dwarf_3eca4::reportTypeMismatch
                        ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)0x1260a1,pcVar51,
                         (Importable *)0xffffffffffffffff);
              poVar25 = std::operator<<((ostream *)&std::cerr,"expecting a bounded ");
              poVar25 = std::operator<<(poVar25,"memory");
              poVar25 = std::operator<<(poVar25," but the imported ");
              poVar25 = std::operator<<(poVar25,"memory");
              pcVar51 = " is unbounded.\n";
            }
            else {
              if ((ulong)auVar36 <= *(Module **)(pcVar51 + 0x40)) goto LAB_00116f44;
              anon_unknown.dwarf_3eca4::reportTypeMismatch
                        ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)0x1260a1,pcVar51,
                         (Importable *)auVar36);
              poVar25 = std::operator<<((ostream *)&std::cerr,"maximal size ");
              poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
              poVar25 = std::operator<<(poVar25," is larger than expected maximal size ");
              poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
              pcVar51 = ".\n";
            }
            std::operator<<(poVar25,pcVar51);
          }
        }
      }
LAB_00116f44:
    }
    for (puVar52 = DAT_00133348; puVar49 = DAT_00133368, puVar52 != puVar48; puVar52 = puVar52 + 1)
    {
      pcVar51 = (char *)*puVar52;
      if (*(long *)(pcVar51 + 0x20) != 0) {
        auStack_3f8._0_4_ = 3;
        p_Var30 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_d0,(key_type *)auStack_3f8);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var30,(key_type *)(pcVar51 + 0x18));
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)(pcVar51 + 0x28));
        if ((pmVar32->super_IString).str._M_str != (char *)0x0) {
          NVar60.super_IString.str._M_str = (char *)(pmVar32->super_IString).str._M_len;
          NVar60.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
          lVar33 = wasm::Module::getGlobal(NVar60);
          bVar21 = *(byte *)(lVar33 + 0x48);
          if (bVar21 != pcVar51[0x48]) {
            anon_unknown.dwarf_3eca4::reportTypeMismatch
                      ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)"global",pcVar51,
                       (Importable *)auVar36);
            std::operator<<((ostream *)&std::cerr,"mutability should match.\n");
            bVar21 = *(byte *)(lVar33 + 0x48);
          }
          if (((bVar21 & 1) != 0) &&
             (auVar36 = *(undefined1 (*) [8])(lVar33 + 0x38),
             auVar36 != (undefined1  [8])*(Module **)(pcVar51 + 0x38))) {
            anon_unknown.dwarf_3eca4::reportTypeMismatch
                      ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)"global",pcVar51,
                       (Importable *)auVar36);
            poVar25 = std::operator<<((ostream *)&std::cerr,"export type ");
            poVar25 = (ostream *)wasm::operator<<(poVar25,(Type)*(uintptr_t *)(lVar33 + 0x38));
            poVar25 = std::operator<<(poVar25," is different from import type ");
            poVar25 = (ostream *)wasm::operator<<(poVar25,(Type)*(uintptr_t *)(pcVar51 + 0x38));
            std::operator<<(poVar25,".\n");
            bVar21 = *(byte *)(lVar33 + 0x48);
          }
          if (((bVar21 & 1) == 0) &&
             (cVar20 = wasm::Type::isSubType
                                 ((Type)*(uintptr_t *)(lVar33 + 0x38),
                                  (Type)*(uintptr_t *)(pcVar51 + 0x38)), cVar20 == '\0')) {
            anon_unknown.dwarf_3eca4::reportTypeMismatch
                      ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)"global",pcVar51,
                       (Importable *)auVar36);
            poVar25 = std::operator<<((ostream *)&std::cerr,"type ");
            poVar25 = (ostream *)wasm::operator<<(poVar25,(Type)*(uintptr_t *)(lVar33 + 0x38));
            poVar25 = std::operator<<(poVar25," is not a subtype of ");
            poVar25 = (ostream *)wasm::operator<<(poVar25,(Type)*(uintptr_t *)(pcVar51 + 0x38));
            std::operator<<(poVar25,".\n");
          }
        }
      }
    }
    for (puVar52 = DAT_00133360; puVar52 != puVar49; puVar52 = puVar52 + 1) {
      pcVar51 = (char *)*puVar52;
      if (*(long *)(pcVar51 + 0x20) != 0) {
        auStack_3f8._0_4_ = 4;
        p_Var30 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_d0,(key_type *)auStack_3f8);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var30,(key_type *)(pcVar51 + 0x18));
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)(pcVar51 + 0x28));
        if (((pmVar32->super_IString).str._M_str != (char *)0x0) &&
           (NVar61.super_IString.str._M_str = (char *)(pmVar32->super_IString).str._M_len,
           NVar61.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged,
           lVar33 = wasm::Module::getTag(NVar61),
           *(long *)(lVar33 + 0x38) != *(long *)(pcVar51 + 0x38))) {
          anon_unknown.dwarf_3eca4::reportTypeMismatch
                    ((anon_unknown_dwarf_3eca4 *)auStack_88,(bool *)"tag",pcVar51,
                     (Importable *)auVar36);
          poVar25 = std::operator<<((ostream *)&std::cerr,"export type ");
          poVar25 = (ostream *)wasm::operator<<(poVar25,(HeapType)*(uintptr_t *)(lVar33 + 0x38));
          poVar25 = std::operator<<(poVar25," is different from import type ");
          poVar25 = (ostream *)wasm::operator<<(poVar25,(HeapType)*(uintptr_t *)(pcVar51 + 0x38));
          std::operator<<(poVar25,".\n");
        }
      }
    }
    if ((allocator<char>)auStack_88[0] != (allocator<char>)0x0) {
      anon_unknown.dwarf_3eca4::updateNames
                ((Module *)&(anonymous_namespace)::merged,(KindNameUpdates *)local_1c0);
      std::
      _Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_1c0);
      std::
      _Hashtable<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_d0);
      wasm::PassRunner::PassRunner
                ((PassRunner *)auStack_3f8,(Module *)&(anonymous_namespace)::merged);
      std::__cxx11::string::string<std::allocator<char>>
                (local_528,"reorder-globals-always",(allocator<char> *)local_d0);
      local_868._M_engaged = false;
      wasm::PassRunner::add(auStack_3f8,local_528);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_868);
      std::__cxx11::string::~string(local_528);
      std::__cxx11::string::string<std::allocator<char>>
                (local_508,"remove-unused-module-elements",(allocator<char> *)local_d0);
      local_840._M_engaged = false;
      wasm::PassRunner::add(auStack_3f8,local_508);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_840);
      std::__cxx11::string::~string(local_508);
      wasm::PassRunner::run();
      wasm::PassRunner::~PassRunner((PassRunner *)auStack_3f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_3f8,"output",(allocator<char> *)local_d0);
      sVar34 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&options.super_Options,(key_type *)auStack_3f8);
      std::__cxx11::string::~string((string *)auStack_3f8);
      if (sVar34 != 0) {
        kindNameUpdates._M_h._M_buckets = (__buckets_ptr)&options.field_0xb0;
        kindNameUpdates._M_h._M_single_bucket = (__node_base_ptr)&local_3b0;
        kindNameUpdates._M_h._M_before_begin._M_nxt =
             (_Hash_node_base *)&kindNameUpdates._M_h._M_rehash_policy;
        kindNameUpdates._M_h._M_element_count = 0;
        kindNameUpdates._M_h._M_rehash_policy._0_8_ =
             kindNameUpdates._M_h._M_rehash_policy._0_8_ & 0xffffffffffffff00;
        local_3b0._M_local_buf[0] = '\0';
        local_3a0._M_p = (pointer)local_390;
        local_398 = (pointer)0x0;
        local_390[0]._M_local_buf[0] = '\0';
        kindNameUpdates._M_h._M_bucket_count =
             CONCAT71((int7)(kindNameUpdates._M_h._M_bucket_count >> 8),local_32) &
             0xffffffffffff00ff;
        auStack_3f8[0] = local_31[0];
        if (outputSourceMapFilename._M_dataplus._M_p != (pointer)0x0) {
          std::__cxx11::string::string
                    (local_4e8,(string *)(outputSourceMapUrl.field_2._M_local_buf + 8));
          std::__cxx11::string::_M_assign((string *)&kindNameUpdates._M_h._M_single_bucket);
          std::__cxx11::string::~string(local_4e8);
          std::__cxx11::string::string(local_4c8,(string *)&local_488);
          std::__cxx11::string::_M_assign((string *)&local_3a0);
          std::__cxx11::string::~string(local_4c8);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d0,"output",(allocator<char> *)local_1c0);
        pmVar35 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&options.super_Options,(key_type *)local_d0);
        std::__cxx11::string::string(local_4a8,(string *)pmVar35);
        wasm::ModuleWriter::write(auStack_3f8,&(anonymous_namespace)::merged,local_4a8);
        std::__cxx11::string::~string(local_4a8);
        std::__cxx11::string::~string((string *)local_d0);
        wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)auStack_3f8);
      }
      wasm::ToolOptions::~ToolOptions((ToolOptions *)local_a08);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)(outputSourceMapUrl.field_2._M_local_buf + 8));
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_758);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_168);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_f8);
      return 0;
    }
    wasm::Fatal::Fatal((Fatal *)auStack_3f8);
    wasm::Fatal::operator<<((Fatal *)auStack_3f8,(char (*) [25])"import/export mismatches");
  }
  else {
    wasm::Fatal::Fatal((Fatal *)auStack_3f8);
    wasm::Fatal::operator<<
              ((Fatal *)auStack_3f8,
               (char (*) [161])
               "Please provide an import name for each input file. In particular, the number of positional inputs must be even as each wasm binary must be followed by its name."
              );
  }
LAB_00117aee:
  wasm::Fatal::~Fatal((Fatal *)auStack_3f8);
}

Assistant:

int main(int argc, const char* argv[]) {
  std::vector<std::string> inputFiles;
  std::vector<std::string> inputFileNames;
  bool emitBinary = true;
  bool debugInfo = false;
  std::map<size_t, std::string> inputSourceMapFilenames;
  std::string outputSourceMapFilename;
  std::string outputSourceMapUrl;

  const std::string WasmMergeOption = "wasm-merge options";

  ToolOptions options("wasm-merge",
                      R"(Merge wasm files into one.

For example,

  wasm-merge foo.wasm foo bar.wasm bar -o merged.wasm

will read foo.wasm and bar.wasm, with names 'foo' and 'bar' respectively, so if the second imports from 'foo', we will see that as an import from the first module after the merge. The merged output will be written to merged.wasm.

Note that filenames and modules names are interleaved (which is hopefully less confusing).

Input source maps can be specified by adding an -ism option right after the module name:

  wasm-merge foo.wasm foo -ism foo.wasm.map ...)");

  options
    .add("--output",
         "-o",
         "Output file",
         WasmMergeOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add_positional("INFILE1 NAME1 INFILE2 NAME2 [..]",
                    Options::Arguments::N,
                    [&](Options* o, const std::string& argument) {
                      if (inputFiles.size() == inputFileNames.size()) {
                        inputFiles.push_back(argument);
                      } else {
                        inputFileNames.push_back(argument);
                      }
                    })
    .add("--input-source-map",
         "-ism",
         "Consume source maps from the specified files",
         WasmMergeOption,
         Options::Arguments::N,
         [&](Options* o, const std::string& argument) {
           size_t pos = inputFiles.size();
           if (pos == 0 || pos != inputFileNames.size() ||
               inputSourceMapFilenames.count(pos - 1)) {
             std::cerr << "Option '-ism " << argument
                       << "' should be right after the module name\n";
             exit(EXIT_FAILURE);
           }
           inputSourceMapFilenames.insert({pos - 1, argument});
         })
    .add("--output-source-map",
         "-osm",
         "Emit source map to the specified file",
         WasmMergeOption,
         Options::Arguments::One,
         [&outputSourceMapFilename](Options* o, const std::string& argument) {
           outputSourceMapFilename = argument;
         })
    .add("--output-source-map-url",
         "-osu",
         "Emit specified string as source map URL",
         WasmMergeOption,
         Options::Arguments::One,
         [&outputSourceMapUrl](Options* o, const std::string& argument) {
           outputSourceMapUrl = argument;
         })
    .add("--rename-export-conflicts",
         "-rec",
         "Rename exports to avoid conflicts (rather than error)",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           exportMergeMode = RenameExportConflicts;
         })
    .add("--skip-export-conflicts",
         "-sec",
         "Skip exports that conflict with previous ones",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           exportMergeMode = SkipExportConflicts;
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; });
  options.parse(argc, argv);

  if (inputFiles.size() != inputFileNames.size()) {
    Fatal() << "Please provide an import name for each input file. "
               "In particular, the number of positional inputs must be even as "
               "each wasm binary must be followed by its name.";
  }

  // Process the inputs.
  // TODO: If the inputs are a very large number of small modules then it might
  //       make sense to parallelize this. (If so, then changing the existing
  //       parallelism above in NameMapper might make sense.)

  for (Index i = 0; i < inputFiles.size(); i++) {
    auto inputFile = inputFiles[i];
    auto inputFileName = inputFileNames[i];
    auto iter = inputSourceMapFilenames.find(i);
    auto inputSourceMapFilename =
      (iter == inputSourceMapFilenames.end()) ? "" : iter->second;

    if (options.debug) {
      std::cerr << "reading input '" << inputFile << "' as '" << inputFileName
                << "'...\n";
    }

    // For the first input, we'll just read it in directly. For later inputs,
    // we read them and then merge.
    std::unique_ptr<Module> laterInput;
    Module* currModule;
    if (i == 0) {
      currModule = &merged;
    } else {
      laterInput = std::make_unique<Module>();
      currModule = laterInput.get();
    }

    options.applyOptionsBeforeParse(*currModule);

    ModuleReader reader;
    try {
      reader.read(inputFile, *currModule, inputSourceMapFilename);
    } catch (ParseException& p) {
      p.dump(std::cerr);
      Fatal() << "error in parsing wasm input: " << inputFile;
    }

    options.applyOptionsAfterParse(*currModule);

    if (options.passOptions.validate) {
      if (!WasmValidator().validate(*currModule)) {
        std::cout << *currModule << '\n';
        Fatal() << "error in validating input: " << inputFile;
      }
    }

    if (!laterInput) {
      // This is the very first module, which we read directly into |merged|.
      // The only other operation we need to do is note the exports for later.
      for (auto& curr : merged.exports) {
        exportModuleMap[curr.get()] = ExportInfo{inputFileName, curr->name};
      }
    } else {
      // This is a later module: do a full merge.
      mergeInto(*currModule, inputFileName);

      if (options.passOptions.validate) {
        if (!WasmValidator().validate(merged)) {
          std::cout << merged << '\n';
          Fatal() << "error in validating merged after: " << inputFile;
        }
      }
    }
  }

  // Fuse imports and exports now that everything is all together in the merged
  // module.
  fuseImportsAndExports();

  {
    PassRunner passRunner(&merged);
    // We might have made some globals read from others that now appear after
    // them (if the one they read was appended from a later module). Sort them
    // to fix that. TODO: we could do this only if we actually append globals
    passRunner.add("reorder-globals-always");
    // Remove unused things. This is obviously a useful optimization but it also
    // makes using the output easier: if an import was resolved by an export
    // during the merge, then that import will have no more uses and it will be
    // optimized out (while if we didn't optimize it out then instantiating the
    // module would still be forced to provide something for that import).
    passRunner.add("remove-unused-module-elements");
    passRunner.run();
  }

  // Output.
  if (options.extra.count("output") > 0) {
    ModuleWriter writer(options.passOptions);
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    if (outputSourceMapFilename.size()) {
      writer.setSourceMapFilename(outputSourceMapFilename);
      writer.setSourceMapUrl(outputSourceMapUrl);
    }
    writer.write(merged, options.extra["output"]);
  }
}